

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<unsigned_long,unsigned_long_const&>
          (robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,unsigned_long *key,unsigned_long *value_type_args)

{
  bool bVar1;
  distance_type dVar2;
  value_type_conflict1 *key_00;
  robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RDI;
  pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar3;
  distance_type dist_from_ideal_bucket;
  size_t ibucket;
  size_t hash;
  bool *in_stack_ffffffffffffff38;
  robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff40;
  robin_iterator<false> *this_00;
  robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff48;
  size_t ibucket_00;
  undefined6 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff56;
  short sVar4;
  robin_iterator<false> local_68 [3];
  undefined1 local_49;
  robin_iterator<false> local_48;
  KeySelect local_3b;
  short local_3a;
  size_t local_38;
  size_t local_30;
  robin_iterator<false> local_10;
  undefined1 local_8;
  
  local_30 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::hash_key<unsigned_long>
                       (in_stack_ffffffffffffff40,(unsigned_long *)in_stack_ffffffffffffff38);
  local_38 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::bucket_for_hash(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
  local_3a = 0;
  do {
    sVar4 = local_3a;
    dVar2 = bucket_entry<unsigned_long,_false>::dist_from_ideal_bucket(in_RDI->m_buckets + local_38)
    ;
    if (dVar2 < sVar4) {
      while (bVar1 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::rehash_on_extreme_load
                               (in_stack_ffffffffffffff48,
                                (distance_type)((ulong)in_stack_ffffffffffffff40 >> 0x30)), bVar1) {
        local_38 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::bucket_for_hash(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
        for (local_3a = 0; sVar4 = local_3a,
            dVar2 = bucket_entry<unsigned_long,_false>::dist_from_ideal_bucket
                              (in_RDI->m_buckets + local_38), sVar4 <= dVar2;
            local_3a = local_3a + 1) {
          local_38 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                               (in_RDI,local_38);
        }
      }
      bVar1 = bucket_entry<unsigned_long,_false>::empty(in_RDI->m_buckets + local_38);
      if (bVar1) {
        bucket_entry<unsigned_long,_false>::truncate_hash(local_30);
        bucket_entry<unsigned_long,false>::set_value_of_empty_bucket<unsigned_long_const&>
                  ((bucket_entry<unsigned_long,_false> *)
                   CONCAT26(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50),
                   (distance_type)((ulong)in_stack_ffffffffffffff48 >> 0x30),
                   (truncated_hash_type)in_stack_ffffffffffffff48,
                   (unsigned_long *)in_stack_ffffffffffffff40);
      }
      else {
        ibucket_00 = local_38;
        sVar4 = local_3a;
        bucket_entry<unsigned_long,_false>::truncate_hash(local_30);
        insert_value<unsigned_long_const&>
                  ((robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *)CONCAT26(sVar4,in_stack_ffffffffffffff50),ibucket_00,
                   (distance_type)((ulong)in_stack_ffffffffffffff40 >> 0x30),
                   (truncated_hash_type)in_stack_ffffffffffffff40,
                   (unsigned_long *)in_stack_ffffffffffffff38);
      }
      in_RDI->m_nb_elements = in_RDI->m_nb_elements + 1;
      this_00 = local_68;
      robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      ::robin_iterator<false>::robin_iterator(this_00,in_RDI->m_buckets + local_38);
      pVar3 = std::
              make_pair<tsl::detail_robin_hash::robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::robin_iterator<false>,bool>
                        (this_00,in_stack_ffffffffffffff38);
      local_8 = pVar3.second;
LAB_002155b3:
      local_10 = pVar3.first.m_bucket;
      pVar3.second = (bool)local_8;
      pVar3.first.m_bucket = local_10.m_bucket;
      return pVar3;
    }
    key_00 = bucket_entry<unsigned_long,_false>::value
                       ((bucket_entry<unsigned_long,_false> *)0x21531d);
    robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::KeySelect::operator()(&local_3b,key_00);
    bVar1 = compare_keys<unsigned_long,unsigned_long>
                      (in_stack_ffffffffffffff40,(unsigned_long *)in_stack_ffffffffffffff38,
                       (unsigned_long *)0x215342);
    if (bVar1) {
      robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      ::robin_iterator<false>::robin_iterator(&local_48,in_RDI->m_buckets + local_38);
      local_49 = 0;
      pVar3 = std::
              make_pair<tsl::detail_robin_hash::robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::robin_iterator<false>,bool>
                        ((robin_iterator<false> *)in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38);
      local_8 = pVar3.second;
      goto LAB_002155b3;
    }
    local_38 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               ::next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>(in_RDI,local_38);
    local_3a = local_3a + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }